

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O1

void __thiscall
o3dgc::Arithmetic_Codec::encode(Arithmetic_Codec *this,uint data,Adaptive_Data_Model *M)

{
  uchar *puVar1;
  uint *puVar2;
  uchar uVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  uint uVar7;
  
  uVar5 = this->base;
  uVar7 = this->length >> 0xf;
  uVar4 = M->distribution[data];
  if (M->last_symbol == data) {
    this->base = uVar7 * uVar4 + uVar5;
    uVar7 = this->length - uVar7 * uVar4;
  }
  else {
    this->length = uVar7;
    this->base = uVar7 * uVar4 + uVar5;
    uVar7 = (M->distribution[data + 1] - uVar4) * uVar7;
  }
  this->length = uVar7;
  if (this->base < uVar5) {
    puVar6 = this->ac_pointer;
    while( true ) {
      puVar1 = puVar6 + -1;
      puVar6 = puVar6 + -1;
      if (*puVar1 != 0xff) break;
      *puVar6 = '\0';
    }
    *puVar6 = *puVar1 + '\x01';
  }
  uVar5 = this->length;
  while (uVar5 < 0x1000000) {
    uVar3 = *(uchar *)((long)&this->base + 3);
    puVar6 = this->ac_pointer;
    this->ac_pointer = puVar6 + 1;
    *puVar6 = uVar3;
    this->base = this->base << 8;
    uVar5 = this->length << 8;
    this->length = uVar5;
  }
  M->symbol_count[data] = M->symbol_count[data] + 1;
  puVar2 = &M->symbols_until_update;
  *puVar2 = *puVar2 - 1;
  if (*puVar2 == 0) {
    Adaptive_Data_Model::update(M,true);
    return;
  }
  return;
}

Assistant:

void Arithmetic_Codec::encode(unsigned data,
                                  Adaptive_Data_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 1) AC_Error("encoder not initialized");
      if (data >= M.data_symbols) 
      {
          AC_Error("invalid data symbol");
      }
    #endif

      unsigned x, init_base = base;
                                                               // compute products
      if (data == M.last_symbol) {
        x = M.distribution[data] * (length >> DM__LengthShift);
        base   += x;                                            // update interval
        length -= x;                                          // no product needed
      }
      else {
        x = M.distribution[data] * (length >>= DM__LengthShift);
        base   += x;                                            // update interval
        length  = M.distribution[data+1] * length - x;
      }

      if (init_base > base) propagate_carry();                 // overflow = carry

      if (length < AC__MinLength) renorm_enc_interval();        // renormalization

      ++M.symbol_count[data];
      if (--M.symbols_until_update == 0) M.update(true);  // periodic model update
    }